

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::PrepareProgram
          (StorageAndSubImageTest *this,GLchar *variable_declaration,GLchar *tail)

{
  ostringstream *poVar1;
  bool *pbVar2;
  char *pcVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  undefined4 *puVar9;
  MessageBuilder *pMVar10;
  long lVar11;
  GLint status_1;
  GLint status;
  GLint log_size;
  GLint log_size_1;
  GLchar *log_text_1;
  int local_234;
  undefined8 local_230;
  int local_224;
  undefined8 local_220;
  char *local_218;
  long local_210 [2];
  undefined8 local_200;
  int local_1f8 [2];
  undefined *local_1f0;
  GLchar *local_1e8;
  GLchar *local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  Enum<int,_2UL> local_1c8;
  bool *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar8;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  local_218 = s_vertex_shader;
  local_210[0] = 0;
  local_210[1] = 0;
  local_200 = 0x8b3100000001;
  local_1f8[0] = 0;
  local_1f0 = s_fragment_shader_head;
  local_1d8 = 0x8b3000000003;
  local_1d0 = 0;
  local_1e8 = variable_declaration;
  local_1e0 = tail;
  GVar5 = (**(code **)(lVar8 + 0x3c8))();
  this->m_po = GVar5;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x9c2);
  lVar11 = 0;
  do {
    uVar7 = (**(code **)(lVar8 + 0x3f0))(*(undefined4 *)((long)local_1f8 + lVar11 + -4));
    *(undefined4 *)((long)local_1f8 + lVar11) = uVar7;
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glCreateShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x9cb);
    (**(code **)(lVar8 + 0x10))(this->m_po,*(undefined4 *)((long)local_1f8 + lVar11));
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glAttachShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x9cf);
    (**(code **)(lVar8 + 0x12b8))
              (*(undefined4 *)((long)local_1f8 + lVar11),
               *(undefined4 *)((long)local_1f8 + lVar11 + -8),(char **)((long)&local_218 + lVar11),0
              );
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glShaderSource call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x9d3);
    (**(code **)(lVar8 + 0x248))(*(undefined4 *)((long)local_1f8 + lVar11));
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glCompileShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x9d7);
    local_234 = 0;
    (**(code **)(lVar8 + 0xa70))(*(undefined4 *)((long)local_1f8 + lVar11),0x8b81,&local_234);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGetShaderiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x9dc);
    if (local_234 == 0) {
      local_224 = 0;
      (**(code **)(lVar8 + 0xa70))(*(undefined4 *)((long)local_1f8 + lVar11),0x8b84);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x9e2);
      iVar4 = local_224;
      local_230 = (char *)operator_new__((long)local_224);
      (**(code **)(lVar8 + 0xa58))(*(undefined4 *)((long)local_1f8 + lVar11),iVar4,0,local_230);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Shader compilation has failed.\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Shader type: ",0xd);
      local_1c8.m_value = *(int *)((long)local_1f8 + lVar11 + -4);
      local_1c8.m_getName = glu::getShaderTypeName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Shader compilation error log:\n",0x1e);
      pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                 "Shader source code:\n",0x14);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char **)((long)&local_218 + lVar11));
      local_220 = *(bool **)((long)local_210 + lVar11);
      if (local_220 == (bool *)0x0) {
        local_220 = glcts::fixed_sample_locations_values + 1;
      }
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char **)&local_220);
      pbVar2 = *(bool **)((long)local_210 + lVar11 + 8);
      local_1b8 = glcts::fixed_sample_locations_values + 1;
      if (pbVar2 != (bool *)0x0) {
        local_1b8 = pbVar2;
      }
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      if (local_230 != (char *)0x0) {
        operator_delete__(local_230);
      }
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetShaderInfoLog call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x9f4);
      puVar9 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar9 = 0;
      __cxa_throw(puVar9,&int::typeinfo,0);
    }
    lVar11 = lVar11 + 0x28;
  } while (lVar11 == 0x28);
  (**(code **)(lVar8 + 0xce8))(this->m_po);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x9fe);
  local_230 = (char *)((ulong)local_230._4_4_ << 0x20);
  (**(code **)(lVar8 + 0x9d8))(this->m_po,0x8b82);
  if ((int)local_230 == 1) {
    lVar11 = 0;
    do {
      if (*(int *)((long)local_1f8 + lVar11) != 0) {
        (**(code **)(lVar8 + 0x4e0))(this->m_po);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0xa0c);
      }
      lVar11 = lVar11 + 0x28;
    } while (lVar11 == 0x28);
    lVar11 = 0x20;
    do {
      if (*(int *)((long)&local_218 + lVar11) != 0) {
        (**(code **)(lVar8 + 0x470))();
        *(undefined4 *)((long)&local_218 + lVar11) = 0;
      }
      lVar11 = lVar11 + 0x28;
    } while (lVar11 == 0x48);
    if (this->m_po != 0) {
      return;
    }
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&int::typeinfo,0);
  }
  local_220 = (bool *)((ulong)local_220._4_4_ << 0x20);
  (**(code **)(lVar8 + 0x9d8))(this->m_po,0x8b84);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xa16);
  pcVar3 = local_220;
  local_1c8.m_getName = (GetNameFunc)operator_new__((long)(int)local_220);
  (**(code **)(lVar8 + 0x988))(this->m_po,(ulong)pcVar3 & 0xffffffff,0,local_1c8.m_getName);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Program linkage has failed due to:\n",0x23);
  pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (local_1c8.m_getName != (GetNameFunc)0x0) {
    operator_delete__(local_1c8.m_getName);
  }
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGetProgramInfoLog call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xa22);
  puVar9 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar9 = 0;
  __cxa_throw(puVar9,&int::typeinfo,0);
}

Assistant:

void StorageAndSubImageTest::PrepareProgram(const glw::GLchar* variable_declaration, const glw::GLchar* tail)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* source[3];
		glw::GLsizei const count;
		glw::GLenum const  type;
		glw::GLuint		   id;
	} shader[] = { { { s_vertex_shader, NULL, NULL }, 1, GL_VERTEX_SHADER, 0 },
				   { { s_fragment_shader_head, variable_declaration, tail }, 3, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, shader[i].count, shader[i].source, NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Shader compilation has failed.\n"
						<< "Shader type: " << glu::getShaderTypeStr(shader[i].type) << "\n"
						<< "Shader compilation error log:\n"
						<< log_text << "\n"
						<< "Shader source code:\n"
						<< shader[i].source[0] << (shader[i].source[1] ? shader[i].source[1] : "")
						<< (shader[i].source[2] ? shader[i].source[2] : "") << "\n"
						<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(m_po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(m_po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(m_po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (m_po)
		{
			gl.deleteProgram(m_po);

			m_po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (0 == m_po)
	{
		throw 0;
	}
}